

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fVertexAttributeBindingTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::anon_unknown_0::SingleBindingCase::init
          (SingleBindingCase *this,EVP_PKEY_CTX *ctx)

{
  ostringstream *poVar1;
  TestSpec *value;
  int *piVar2;
  ostringstream *poVar3;
  int iVar4;
  MessageBuilder *pMVar5;
  EVP_PKEY_CTX *ctx_00;
  undefined1 local_1b0 [384];
  
  local_1b0._0_8_ =
       ((this->super_BindingRenderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
       m_log;
  poVar3 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar3);
  std::operator<<((ostream *)poVar3,"Rendering ");
  std::ostream::operator<<(poVar3,0x14);
  std::operator<<((ostream *)poVar3,"x");
  std::ostream::operator<<(poVar3,0x14);
  std::operator<<((ostream *)poVar3," grid.\n");
  std::operator<<((ostream *)poVar3,"Buffer format:\n");
  std::operator<<((ostream *)poVar3,"\tbufferOffset: ");
  value = &this->m_spec;
  pMVar5 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,&value->bufferOffset);
  std::operator<<(&(pMVar5->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"\n");
  std::operator<<(&(pMVar5->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                  "\tbufferStride: ");
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&(this->m_spec).bufferStride);
  poVar1 = &pMVar5->m_str;
  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"\n");
  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                  "Vertex position format:\n");
  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"\ttype: float4\n");
  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"\toffset: ");
  piVar2 = &(this->m_spec).positionAttrOffset;
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,piVar2);
  poVar1 = &pMVar5->m_str;
  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"\n");
  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"\ttotal offset: ");
  std::ostream::operator<<(poVar1,*piVar2 + value->bufferOffset);
  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"\n");
  ctx_00 = (EVP_PKEY_CTX *)&tcu::TestLog::EndMessage;
  tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar3);
  if ((this->m_spec).hasColorAttr == true) {
    local_1b0._0_8_ =
         ((this->super_BindingRenderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
         m_log;
    poVar3 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::operator<<((ostream *)poVar3,"Color:\n");
    std::operator<<((ostream *)poVar3,"\ttype: float4\n");
    std::operator<<((ostream *)poVar3,"\toffset: ");
    piVar2 = &(this->m_spec).colorAttrOffset;
    pMVar5 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,piVar2);
    poVar1 = &pMVar5->m_str;
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"\n");
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"\ttotal offset: ");
    std::ostream::operator<<(poVar1,*piVar2 + value->bufferOffset);
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"\n");
    ctx_00 = (EVP_PKEY_CTX *)&tcu::TestLog::EndMessage;
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar3);
  }
  iVar4 = BindingRenderCase::init(&this->super_BindingRenderCase,ctx_00);
  return iVar4;
}

Assistant:

void SingleBindingCase::init (void)
{
	// log what we are trying to do

	m_testCtx.getLog()	<< tcu::TestLog::Message
						<< "Rendering " << (int)GRID_SIZE << "x" << (int)GRID_SIZE << " grid.\n"
						<< "Buffer format:\n"
						<< "	bufferOffset: " << m_spec.bufferOffset << "\n"
						<< "	bufferStride: " << m_spec.bufferStride << "\n"
						<< "Vertex position format:\n"
						<< "	type: float4\n"
						<< "	offset: " << m_spec.positionAttrOffset << "\n"
						<< "	total offset: " << m_spec.bufferOffset + m_spec.positionAttrOffset << "\n"
						<< tcu::TestLog::EndMessage;

	if (m_spec.hasColorAttr)
		m_testCtx.getLog()	<< tcu::TestLog::Message
							<< "Color:\n"
							<< "	type: float4\n"
							<< "	offset: " << m_spec.colorAttrOffset << "\n"
							<< "	total offset: " << m_spec.bufferOffset + m_spec.colorAttrOffset << "\n"
							<< tcu::TestLog::EndMessage;
	// init

	BindingRenderCase::init();
}